

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void preprocess_unsigned(aec_stream *strm)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  internal_state *piVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  uint uVar9;
  size_t i;
  ulong uVar10;
  
  piVar6 = strm->state;
  puVar7 = piVar6->data_raw;
  puVar8 = piVar6->data_pp;
  uVar1 = piVar6->xmax;
  uVar2 = strm->block_size;
  uVar3 = strm->rsi;
  piVar6->ref = 1;
  piVar6->ref_sample = *puVar7;
  *puVar8 = 0;
  for (uVar10 = 0; uVar2 * uVar3 - 1 != uVar10; uVar10 = uVar10 + 1) {
    uVar4 = puVar7[uVar10];
    uVar5 = puVar7[uVar10 + 1];
    if (uVar5 < uVar4) {
      if (uVar1 - uVar4 < uVar4 - uVar5) {
        uVar9 = uVar1 - uVar5;
      }
      else {
        uVar9 = (uVar4 - uVar5) * 2 - 1;
      }
    }
    else {
      uVar9 = (uVar5 - uVar4) * 2;
      if (uVar4 < uVar5 - uVar4) {
        uVar9 = uVar5;
      }
    }
    puVar8[uVar10 + 1] = uVar9;
  }
  piVar6->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
  return;
}

Assistant:

static void preprocess_unsigned(struct aec_stream *strm)
{
    /**
       Preprocess RSI of unsigned samples.

       Combining preprocessing and converting to uint32_t in one loop
       is slower due to the data dependence on x_i-1.
    */

    uint32_t D;
    struct internal_state *state = strm->state;
    const uint32_t *restrict x = state->data_raw;
    uint32_t *restrict d = state->data_pp;
    uint32_t xmax = state->xmax;
    uint32_t rsi = strm->rsi * strm->block_size - 1;

    state->ref = 1;
    state->ref_sample = x[0];
    d[0] = 0;
    for (size_t i = 0; i < rsi; i++) {
        if (x[i + 1] >= x[i]) {
            D = x[i + 1] - x[i];
            if (D <= x[i])
                d[i + 1] = 2 * D;
            else
                d[i + 1] = x[i + 1];
        } else {
            D = x[i] - x[i + 1];
            if (D <= xmax - x[i])
                d[i + 1] = 2 * D - 1;
            else
                d[i + 1] = xmax - x[i + 1];
        }
    }
    state->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
}